

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

int resolve_leafref(lyd_node_leaf_list *leaf,char *path,int req_inst,lyd_node **ret)

{
  lyd_node *plVar1;
  int iVar2;
  lys_module *plVar3;
  long lVar4;
  undefined1 auStack_78 [8];
  lyxp_set xp_set;
  
  xp_set.ht = (hash_table *)0x0;
  xp_set.ctx_pos = 0;
  xp_set.ctx_size = 0;
  xp_set.val._8_8_ = 0;
  xp_set.used = 0;
  xp_set.size = 0;
  xp_set._8_8_ = 0;
  xp_set.val.nodes = (lyxp_set_node *)0x0;
  auStack_78 = (undefined1  [8])0x0;
  xp_set.type = LYXP_SET_EMPTY;
  xp_set._4_4_ = 0;
  *ret = (lyd_node *)0x0;
  plVar3 = lyd_node_module((lyd_node *)leaf);
  iVar2 = lyxp_eval(path,(lyd_node *)leaf,LYXP_NODE_ELEM,plVar3,(lyxp_set *)auStack_78,0);
  if (iVar2 == 0) {
    if (auStack_78._0_4_ == LYXP_SET_NODE_SET) {
      for (lVar4 = 0; (xp_set.val._8_8_ & 0xffffffff) << 4 != lVar4; lVar4 = lVar4 + 0x10) {
        if (((*(int *)(xp_set._8_8_ + 8 + lVar4) == 2) &&
            (plVar1 = *(lyd_node **)(xp_set._8_8_ + lVar4),
            (plVar1->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN)) &&
           ((hash_table *)leaf->value_str == plVar1->ht)) {
          *ret = plVar1;
          break;
        }
      }
    }
    iVar2 = 0;
    lyxp_set_cast((lyxp_set *)auStack_78,LYXP_SET_EMPTY,(lyd_node *)leaf,(lys_module *)0x0,0);
    if (*ret == (lyd_node *)0x0) {
      if (req_inst < 0) {
        iVar2 = 0;
        ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,
               "There is no leafref \"%s\" with the value \"%s\", but it is not required.",path,
               leaf->value_str);
      }
      else {
        ly_vlog(leaf->schema->module->ctx,LYE_NOLEAFREF,LY_VLOG_LYD,leaf,path,leaf->value_str);
        iVar2 = 1;
      }
    }
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int
resolve_leafref(struct lyd_node_leaf_list *leaf, const char *path, int req_inst, struct lyd_node **ret)
{
    struct lyxp_set xp_set;
    uint32_t i;

    memset(&xp_set, 0, sizeof xp_set);
    *ret = NULL;

    /* syntax was already checked, so just evaluate the path using standard XPath */
    if (lyxp_eval(path, (struct lyd_node *)leaf, LYXP_NODE_ELEM, lyd_node_module((struct lyd_node *)leaf), &xp_set, 0) != EXIT_SUCCESS) {
        return -1;
    }

    if (xp_set.type == LYXP_SET_NODE_SET) {
        for (i = 0; i < xp_set.used; ++i) {
            if ((xp_set.val.nodes[i].type != LYXP_NODE_ELEM) || !(xp_set.val.nodes[i].node->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                continue;
            }

            /* not that the value is already in canonical form since the parsers does the conversion,
             * so we can simply compare just the values */
            if (ly_strequal(leaf->value_str, ((struct lyd_node_leaf_list *)xp_set.val.nodes[i].node)->value_str, 1)) {
                /* we have the match */
                *ret = xp_set.val.nodes[i].node;
                break;
            }
        }
    }

    lyxp_set_cast(&xp_set, LYXP_SET_EMPTY, (struct lyd_node *)leaf, NULL, 0);

    if (!*ret) {
        /* reference not found */
        if (req_inst > -1) {
            LOGVAL(leaf->schema->module->ctx, LYE_NOLEAFREF, LY_VLOG_LYD, leaf, path, leaf->value_str);
            return EXIT_FAILURE;
        } else {
            LOGVRB("There is no leafref \"%s\" with the value \"%s\", but it is not required.", path, leaf->value_str);
        }
    }

    return EXIT_SUCCESS;
}